

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildCommand.cxx
# Opt level: O0

bool __thiscall
cmBuildCommand::TwoArgsSignature
          (cmBuildCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  bool ignoreErrors;
  size_type sVar2;
  char *pcVar3;
  cmGlobalGenerator *this_00;
  allocator local_151;
  string local_150;
  undefined4 local_130;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  undefined1 local_e0 [8];
  string makecommand;
  char *cfg;
  undefined1 local_b0 [8];
  string configType;
  string local_88;
  char *local_68;
  char *cacheValue;
  char *define;
  allocator local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmBuildCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"called with less than two arguments",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_20,0);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pcVar1 = (this->super_cmCommand).Makefile;
    cacheValue = pcVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_88,pcVar3,(allocator *)(configType.field_2._M_local_buf + 0xf));
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)(configType.field_2._M_local_buf + 0xf));
    local_68 = pcVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_b0,"Release",(allocator *)((long)&cfg + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&cfg + 7));
    makecommand.field_2._8_8_ = getenv("CMAKE_CONFIG_TYPE");
    if (((char *)makecommand.field_2._8_8_ != (char *)0x0) &&
       (*(char *)makecommand.field_2._8_8_ != '\0')) {
      std::__cxx11::string::operator=((string *)local_b0,(char *)makecommand.field_2._8_8_);
    }
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"",&local_101);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,"",&local_129);
    ignoreErrors = cmMakefile::IgnoreErrorsCMP0061((this->super_cmCommand).Makefile);
    cmGlobalGenerator::GenerateCMakeBuildCommand
              ((string *)local_e0,this_00,&local_100,(string *)local_b0,&local_128,ignoreErrors);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    pcVar3 = cacheValue;
    if (local_68 == (char *)0x0) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_150,pcVar3,&local_151);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddCacheDefinition
                (pcVar1,&local_150,pcVar3,
                 "Command used to build entire project from the command line.",STRING,false);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
    }
    this_local._7_1_ = 1;
    local_130 = 1;
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)local_b0);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmBuildCommand
::TwoArgsSignature(std::vector<std::string> const& args)
{
  if(args.size() < 2 )
    {
    this->SetError("called with less than two arguments");
    return false;
    }

  const char* define = args[0].c_str();
  const char* cacheValue
    = this->Makefile->GetDefinition(define);

  std::string configType = "Release";
  const char* cfg = getenv("CMAKE_CONFIG_TYPE");
  if ( cfg && *cfg )
    {
    configType = cfg;
    }

  std::string makecommand = this->Makefile->GetGlobalGenerator()
    ->GenerateCMakeBuildCommand("", configType, "",
                                this->Makefile->IgnoreErrorsCMP0061());

  if(cacheValue)
    {
    return true;
    }
  this->Makefile->AddCacheDefinition(define,
                                 makecommand.c_str(),
                                 "Command used to build entire project "
                                 "from the command line.",
                                 cmState::STRING);
  return true;
}